

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclHashCells(SC_Lib *p)

{
  ulong uVar1;
  uint uVar2;
  int *piVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *__assertion;
  int iVar9;
  
  if (p->nBins != 0) {
    __assertion = "p->nBins == 0";
    uVar5 = 0x45;
LAB_003578bb:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                  ,uVar5,"void Abc_SclHashCells(SC_Lib *)");
  }
  iVar9 = (p->vCells).nSize;
  uVar5 = iVar9 * 5 - 1;
  do {
    do {
      uVar6 = uVar5 + 1;
      uVar2 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar2 != 0);
    uVar8 = 3;
    do {
      iVar7 = (int)uVar8;
      if (uVar6 < (uint)(iVar7 * iVar7)) {
        p->nBins = uVar6;
        piVar3 = (int *)malloc((long)(int)uVar6 << 2);
        memset(piVar3,0xff,(long)(int)uVar6 << 2);
        p->pBins = piVar3;
        iVar7 = 0;
        while( true ) {
          if (iVar9 <= iVar7) {
            return;
          }
          puVar4 = (undefined8 *)Vec_PtrEntry(&p->vCells,iVar7);
          piVar3 = Abc_SclHashLookup(p,(char *)*puVar4);
          if (*piVar3 != -1) break;
          *piVar3 = iVar7;
          iVar7 = iVar7 + 1;
          iVar9 = (p->vCells).nSize;
        }
        __assertion = "*pPlace == -1";
        uVar5 = 0x4b;
        goto LAB_003578bb;
      }
      uVar1 = (ulong)uVar6 % uVar8;
      uVar8 = (ulong)(iVar7 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

void Abc_SclHashCells( SC_Lib * p )
{
    SC_Cell * pCell;
    int i, * pPlace;
    assert( p->nBins == 0 );
    p->nBins = Abc_PrimeCudd( 5 * SC_LibCellNum(p) );
    p->pBins = ABC_FALLOC( int, p->nBins );
    SC_LibForEachCell( p, pCell, i )
    {
        pPlace = Abc_SclHashLookup( p, pCell->pName );
        assert( *pPlace == -1 );
        *pPlace = i;
    }
}